

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparsityStructure.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::SparsityStructure::addNonZero
          (SparsityStructure *this,size_t row,size_t col)

{
  ulong uVar1;
  iterator iVar2;
  bool bVar3;
  unsigned_long __val;
  size_t __val_00;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_t sVar7;
  ulong *puVar8;
  unsigned_long uVar9;
  __hashtable *__h;
  char cVar10;
  ulong uVar11;
  string __str_1;
  string __str;
  __node_gen_type __node_gen;
  unsigned_long local_c0;
  ulong *local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  ulong local_a8 [2];
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  size_t local_58;
  long *local_50;
  uint local_48;
  long local_40 [2];
  SparsityStructure *local_30;
  
  iVar2._M_current =
       (this->m_nonZeroElementRows).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_c0 = col;
  local_58 = row;
  if (iVar2._M_current ==
      (this->m_nonZeroElementRows).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->m_nonZeroElementRows,
               iVar2,&local_58);
  }
  else {
    *iVar2._M_current = row;
    (this->m_nonZeroElementRows).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->m_nonZeroElementColumns).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_nonZeroElementColumns).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->m_nonZeroElementColumns
               ,iVar2,&local_c0);
  }
  else {
    *iVar2._M_current = local_c0;
    (this->m_nonZeroElementColumns).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  __val_00 = local_58;
  cVar10 = '\x01';
  if (9 < local_58) {
    sVar7 = local_58;
    cVar4 = '\x04';
    do {
      cVar10 = cVar4;
      if (sVar7 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0017ef06;
      }
      if (sVar7 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0017ef06;
      }
      if (sVar7 < 10000) goto LAB_0017ef06;
      bVar3 = 99999 < sVar7;
      sVar7 = sVar7 / 10000;
      cVar4 = cVar10 + '\x04';
    } while (bVar3);
    cVar10 = cVar10 + '\x01';
  }
LAB_0017ef06:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,__val_00);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  __val = local_c0;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_68 = *puVar8;
    lStack_60 = plVar5[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar8;
    local_78 = (ulong *)*plVar5;
  }
  local_70 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar10 = '\x01';
  if (9 < local_c0) {
    uVar9 = local_c0;
    cVar4 = '\x04';
    do {
      cVar10 = cVar4;
      if (uVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0017efe7;
      }
      if (uVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0017efe7;
      }
      if (uVar9 < 10000) goto LAB_0017efe7;
      bVar3 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar10 + '\x04';
    } while (bVar3);
    cVar10 = cVar10 + '\x01';
  }
LAB_0017efe7:
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,local_b0,__val);
  uVar1 = CONCAT44(uStack_ac,local_b0) + local_70;
  uVar11 = 0xf;
  if (local_78 != &local_68) {
    uVar11 = local_68;
  }
  if (uVar11 < uVar1) {
    uVar11 = 0xf;
    if (local_b8 != local_a8) {
      uVar11 = local_a8[0];
    }
    if (uVar1 <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_78);
      goto LAB_0017f06b;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_b8);
LAB_0017f06b:
  local_98 = &local_88;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_88 = *plVar5;
    uStack_80 = *(undefined4 *)(puVar6 + 3);
    uStack_7c = *(undefined4 *)((long)puVar6 + 0x1c);
  }
  else {
    local_88 = *plVar5;
    local_98 = (long *)*puVar6;
  }
  local_90 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  local_30 = this;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<std::__cxx11::string,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this,&local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void iDynTree::optimalcontrol::SparsityStructure::addNonZero(size_t row, size_t col)
{
    m_nonZeroElementRows.push_back(row);
    m_nonZeroElementColumns.push_back(col);
    m_register.insert(std::to_string(row) + "_" + std::to_string(col));
}